

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::ContractBuffer(FlowBuffer *this)

{
  void *pvVar1;
  undefined8 uVar2;
  long in_RDI;
  uchar *new_buf;
  char *in_stack_00000038;
  ExceptionFlowBufferAlloc *in_stack_00000040;
  
  if (_DAT_00107230 <= *(int *)(in_RDI + 0xc)) {
    *(undefined4 *)(in_RDI + 0xc) = _DAT_0010722c;
    pvVar1 = realloc(*(void **)(in_RDI + 0x10),(long)*(int *)(in_RDI + 0xc));
    if (pvVar1 == (void *)0x0) {
      uVar2 = __cxa_allocate_exception(0x20);
      ExceptionFlowBufferAlloc::ExceptionFlowBufferAlloc(in_stack_00000040,in_stack_00000038);
      __cxa_throw(uVar2,&ExceptionFlowBufferAlloc::typeinfo,
                  ExceptionFlowBufferAlloc::~ExceptionFlowBufferAlloc);
    }
    *(void **)(in_RDI + 0x10) = pvVar1;
  }
  return;
}

Assistant:

void FlowBuffer::ContractBuffer()
	{
	if ( buffer_length_ < policy.contract_threshold )
		return;

	buffer_length_ = policy.min_capacity;
	unsigned char* new_buf = (unsigned char*)realloc(buffer_, buffer_length_);

	if ( ! new_buf )
		throw ExceptionFlowBufferAlloc("contract realloc OOM");

	buffer_ = new_buf;
	}